

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

int ConvexDecomposition::AssertIntact(ConvexH *convex)

{
  ulong uVar1;
  uchar uVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  HalfEdge *pHVar8;
  float3 *pfVar9;
  Plane *pPVar10;
  float fVar11;
  char *__function;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  undefined1 auVar21 [56];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float3 fVar25;
  undefined1 auVar24 [60];
  
  uVar16 = (convex->edges).count;
  pHVar8 = (convex->edges).element;
  uVar12 = 0;
  uVar14 = 0;
  while ((~((int)uVar16 >> 0x1f) & uVar16) != uVar14) {
    if (((int)uVar12 < 0) || ((int)uVar16 <= (int)uVar12)) goto LAB_0092f042;
    uVar2 = pHVar8[uVar14].p;
    if (pHVar8[uVar12].p != uVar2) {
      uVar12 = (uint)uVar14;
    }
    uVar13 = (uint)(uVar14 + 1);
    uVar17 = uVar12;
    if (((int)uVar13 < (int)uVar16) && (pHVar8[uVar14 + 1].p == uVar2)) {
      uVar17 = uVar13;
    }
    if (((int)uVar17 < 0) || ((int)uVar16 <= (int)uVar17)) goto LAB_0092f042;
    if (pHVar8[uVar17].p != uVar2) {
      __assert_fail("convex.edges[inext].p == convex.edges[i].p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c1,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    sVar5 = pHVar8[uVar14].ea;
    if (sVar5 == -1) {
      return 0;
    }
    if (sVar5 == 0xff) {
      __assert_fail("nb!=255",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c3,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    if ((sVar5 < 0) || ((int)uVar16 <= (int)sVar5)) goto LAB_0092f042;
    bVar19 = uVar14 != (uint)(int)pHVar8[(uint)(int)sVar5].ea;
    uVar14 = uVar14 + 1;
    if (bVar19) {
      __assert_fail("i== convex.edges[nb].ea",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c6,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
  }
  uVar16 = (convex->edges).count;
  uVar14 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    return 1;
  }
  uVar18 = 0;
LAB_0092ee55:
  iVar6 = (convex->edges).count;
  if ((long)iVar6 <= (long)uVar18) {
LAB_0092f042:
    __function = 
    "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
    ;
LAB_0092f057:
    __assert_fail("i>=0 && i<count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x577,__function);
  }
  pHVar8 = (convex->edges).element;
  bVar3 = pHVar8[uVar18].p;
  if ((convex->facets).count <= (int)(uint)bVar3) {
LAB_0092f0b6:
    __function = 
    "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
    ;
    goto LAB_0092f057;
  }
  bVar4 = pHVar8[uVar18].v;
  iVar7 = (convex->vertices).count;
  if ((int)(uint)bVar4 < iVar7) {
    pfVar9 = (convex->vertices).element;
    pPVar10 = (convex->facets).element;
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(pfVar9[bVar4].y * pPVar10[bVar3].normal.y)),
                              ZEXT416((uint)pfVar9[bVar4].x),ZEXT416((uint)pPVar10[bVar3].normal.x))
    ;
    auVar22 = vfmadd132ss_fma(ZEXT416((uint)pfVar9[bVar4].z),auVar22,
                              ZEXT416((uint)pPVar10[bVar3].normal.z));
    fVar11 = auVar22._0_4_ + pPVar10[bVar3].dist;
    auVar21 = (undefined1  [56])0x0;
    if ((planetestepsilon < fVar11) ||
       (auVar22._0_4_ = -planetestepsilon, auVar22._4_4_ = 0x80000000, auVar22._8_4_ = 0x80000000,
       auVar22._12_4_ = 0x80000000, auVar24 = ZEXT1260(auVar22._4_12_), fVar11 < auVar22._0_4_)) {
      __assert_fail("COPLANAR==PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x6c9,"int ConvexDecomposition::AssertIntact(ConvexH &)");
    }
    if (((int)uVar12 < 0) || (iVar6 <= (int)uVar12)) goto LAB_0092f042;
    if (pHVar8[uVar12].p != bVar3) {
      uVar12 = (uint)uVar18;
    }
    uVar1 = uVar18 + 1;
    uVar16 = uVar12;
    if ((long)uVar1 < (long)(int)uVar14) {
      if ((long)iVar6 <= (long)uVar1) goto LAB_0092f042;
      if (pHVar8[uVar18 + 1].p == bVar3) {
        uVar16 = (uint)uVar1;
      }
    }
    uVar17 = uVar16 + 1;
    if ((int)uVar17 < (int)uVar14) {
      if (((int)uVar16 < -1) || (iVar6 <= (int)uVar17)) goto LAB_0092f042;
      if (pHVar8[uVar17].p != bVar3) goto LAB_0092ef4c;
    }
    else {
LAB_0092ef4c:
      uVar17 = uVar12;
    }
    iVar15 = 7;
    if (uVar18 == uVar17) {
LAB_0092f012:
      if ((iVar15 != 7) && (iVar15 != 0)) {
        return 0;
      }
      uVar14 = (ulong)(convex->edges).count;
      uVar18 = uVar1;
      if ((long)uVar14 <= (long)uVar1) {
        return 1;
      }
      goto LAB_0092ee55;
    }
    if (((int)uVar16 < 0) || (iVar6 <= (int)uVar16)) goto LAB_0092f042;
    if (iVar7 <= (int)(uint)pHVar8[uVar16].v) goto LAB_0092f09f;
    if (((int)uVar17 < 0) || (iVar6 <= (int)uVar17)) goto LAB_0092f042;
    if ((int)(uint)pHVar8[uVar17].v < iVar7) {
      fVar25 = TriNormal(pfVar9 + bVar4,pfVar9 + pHVar8[uVar16].v,pfVar9 + pHVar8[uVar17].v);
      auVar23._0_4_ = fVar25.z;
      auVar23._4_60_ = auVar24;
      auVar20._0_8_ = fVar25._0_8_;
      auVar20._8_56_ = auVar21;
      if ((long)uVar18 < (long)(convex->edges).count) {
        bVar3 = (convex->edges).element[uVar18].p;
        if ((convex->facets).count <= (int)(uint)bVar3) goto LAB_0092f0b6;
        pPVar10 = (convex->facets).element;
        auVar22 = vmovshdup_avx(auVar20._0_16_);
        auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ * pPVar10[bVar3].normal.y)),
                                  auVar20._0_16_,ZEXT416((uint)pPVar10[bVar3].normal.x));
        auVar22 = vfmadd231ss_fma(auVar22,auVar23._0_16_,ZEXT416((uint)pPVar10[bVar3].normal.z));
        iVar15 = 0;
        if (auVar22._0_4_ <= 0.0) {
          __assert_fail("dot(localnormal,convex.facets[convex.edges[i].p].normal)>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x6da,"int ConvexDecomposition::AssertIntact(ConvexH &)");
        }
        goto LAB_0092f012;
      }
      goto LAB_0092f042;
    }
  }
LAB_0092f09f:
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
  goto LAB_0092f057;
}

Assistant:

int AssertIntact(ConvexH &convex) {
	int i;
	int estart=0;
	for(i=0;i<convex.edges.count;i++) {
		if(convex.edges[estart].p!= convex.edges[i].p) {
			estart=i;
		}
		int inext = i+1;
		if(inext>= convex.edges.count || convex.edges[inext].p != convex.edges[i].p) {
			inext = estart;
		}
		assert(convex.edges[inext].p == convex.edges[i].p);
		int nb = convex.edges[i].ea;
		assert(nb!=255);
		if(nb==255 || nb==-1) return 0;
		assert(nb!=-1);
		assert(i== convex.edges[nb].ea);
	}
	for(i=0;i<convex.edges.count;i++) {
		assert(COPLANAR==PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v]));
		if(COPLANAR!=PlaneTest(convex.facets[convex.edges[i].p],convex.vertices[convex.edges[i].v])) return 0;
		if(convex.edges[estart].p!= convex.edges[i].p) {
			estart=i;
		}
		int i1 = i+1;
		if(i1>= convex.edges.count || convex.edges[i1].p != convex.edges[i].p) {
			i1 = estart;
		}
		int i2 = i1+1;
		if(i2>= convex.edges.count || convex.edges[i2].p != convex.edges[i].p) {
			i2 = estart;
		}
		if(i==i2) continue; // i sliced tangent to an edge and created 2 meaningless edges
		REAL3 localnormal = TriNormal(convex.vertices[convex.edges[i ].v],
			                           convex.vertices[convex.edges[i1].v],
			                           convex.vertices[convex.edges[i2].v]);
		assert(dot(localnormal,convex.facets[convex.edges[i].p].normal)>0);
		if(dot(localnormal,convex.facets[convex.edges[i].p].normal)<=0)return 0;
	}
	return 1;
}